

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

char * flatcc_json_printer_error_string(int err)

{
  char *pcStack_10;
  int err_local;
  
  switch(err) {
  case 0:
    pcStack_10 = "ok";
    break;
  case 1:
    pcStack_10 = "bad input";
    break;
  case 2:
    pcStack_10 = "deep recursion";
    break;
  case 3:
    pcStack_10 = "overflow";
    break;
  default:
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

const char *flatcc_json_printer_error_string(int err)
{
    switch (err) {
#define XX(no, str)                                                         \
    case flatcc_json_printer_error_##no:                                    \
        return str;
        FLATCC_JSON_PRINT_ERROR_MAP(XX)
#undef XX
    default:
        return "unknown";
    }
}